

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void Hex::Hexdumper<unsigned_long>::output_bin(ostream *os,remove_const_t<unsigned_long> val)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  ostream oVar5;
  ulong uVar6;
  int iVar7;
  char bits [257];
  ostream aoStack_12a [2];
  byte abStack_128 [264];
  
  uVar6 = 0;
  if (val != 0) {
    do {
      abStack_128[uVar6] = (byte)val & 1 | 0x30;
      uVar6 = uVar6 + 1;
      bVar4 = 1 < val;
      val = val >> 1;
    } while (bVar4);
  }
  abStack_128[uVar6 & 0xffffffff] = 0;
  lVar3 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar3;
  iVar2 = *(int *)(os + lVar3 + 0x10);
  if (os[lVar3 + 0xe1] == (ostream)0x1) {
    oVar5 = poVar1[0xe0];
  }
  else {
    oVar5 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar5;
    poVar1[0xe1] = (ostream)0x1;
  }
  iVar7 = (int)uVar6;
  if (iVar7 < iVar2) {
    aoStack_12a[1] = (ostream)0x20;
    if (oVar5 != (ostream)0x0) {
      aoStack_12a[1] = oVar5;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)(iVar2 - iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
  }
  else {
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  }
  if (0 < iVar7) {
    uVar6 = (uVar6 & 0xffffffff) + 1;
    do {
      aoStack_12a[1] = aoStack_12a[uVar6];
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(aoStack_12a + 1),1);
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }